

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

Gia_Man_t * Nf_ManDeriveMapping(Nf_Man_t *p)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar4;
  Nf_Mat_t *pNVar5;
  int *pCutSet;
  uint *puVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  
  if (p->pGia->vCellMapping != (Vec_Int_t *)0x0) {
    __assert_fail("p->pGia->vCellMapping == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                  ,0x811,"Gia_Man_t *Nf_ManDeriveMapping(Nf_Man_t *)");
  }
  p_00 = Vec_IntAlloc((p->pGia->nObjs + (int)p->pPars->Area) * 2 + (int)p->pPars->Edge);
  Vec_IntFill(p_00,p->pGia->nObjs * 2,0);
  for (iVar8 = 0; pGVar1 = p->pGia, iVar8 < pGVar1->vCis->nSize; iVar8 = iVar8 + 1) {
    pGVar4 = Gia_ManCi(pGVar1,iVar8);
    iVar2 = Gia_ObjId(pGVar1,pGVar4);
    if (iVar2 == 0) break;
    iVar3 = Nf_ObjMapRefNum(p,iVar2,1);
    if (iVar3 != 0) {
      iVar2 = Abc_Var2Lit(iVar2,1);
      Vec_IntWriteEntry(p_00,iVar2,-1);
    }
  }
  iVar8 = 0;
  do {
    pGVar1 = p->pGia;
    if (pGVar1->nObjs <= iVar8) {
      pGVar1->vCellMapping = p_00;
      return pGVar1;
    }
    pGVar4 = Gia_ManObj(pGVar1,iVar8);
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      pGVar4 = Gia_ManObj(p->pGia,iVar8);
      iVar2 = Gia_ObjIsBuf(pGVar4);
      if (iVar2 == 0) {
        for (iVar2 = 0; iVar2 != 2; iVar2 = iVar2 + 1) {
          iVar3 = Nf_ObjMapRefNum(p,iVar8,iVar2);
          if (iVar3 != 0) {
            pNVar5 = Nf_ObjMatchBest(p,iVar8,iVar2);
            if ((pNVar5->field_0x3 & 0x40) == 0) {
              pCutSet = Nf_ObjCutSet(p,iVar8);
              puVar6 = (uint *)Nf_CutFromHandle(pCutSet,*(uint *)pNVar5 >> 0x14 & 0x3ff);
              iVar3 = Abc_Var2Lit(iVar8,iVar2);
              Vec_IntWriteEntry(p_00,iVar3,p_00->nSize);
              Vec_IntPush(p_00,*puVar6 & 0x1f);
              bVar7 = 0;
              for (uVar9 = 0; uVar9 < (*puVar6 & 0x1f); uVar9 = uVar9 + 1) {
                if (puVar6[(ulong)(((uint)pNVar5->Cfg >> 8) >> (bVar7 & 0x1f) & 0xf) + 1] == 0)
                break;
                iVar3 = Abc_Var2Lit(puVar6[(ulong)(((uint)pNVar5->Cfg >> 8) >> (bVar7 & 0x1f) & 0xf)
                                           + 1],
                                    (uint)((((uint)pNVar5->Cfg >> 1 & 0x7f) >> (uVar9 & 0x1f) & 1)
                                          != 0));
                Vec_IntPush(p_00,iVar3);
                bVar7 = bVar7 + 4;
              }
              Vec_IntPush(p_00,*(uint *)pNVar5 & 0xfffff);
            }
            else {
              iVar3 = Abc_Var2Lit(iVar8,iVar2);
              Vec_IntWriteEntry(p_00,iVar3,-1);
            }
          }
        }
      }
      else {
        iVar2 = Nf_ObjMapRefNum(p,iVar8,1);
        if (iVar2 != 0) {
          iVar2 = Abc_Var2Lit(iVar8,1);
          Vec_IntWriteEntry(p_00,iVar2,-1);
        }
        iVar2 = Abc_Var2Lit(iVar8,0);
        Vec_IntWriteEntry(p_00,iVar2,-2);
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Nf_ManDeriveMapping( Nf_Man_t * p )
{
    Vec_Int_t * vMapping;
    Nf_Mat_t * pM;
    int i, k, c, Id, iVar, fCompl, * pCut;
    assert( p->pGia->vCellMapping == NULL );
    vMapping = Vec_IntAlloc( 2*Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, 2*Gia_ManObjNum(p->pGia), 0 );
    // create CI inverters
    Gia_ManForEachCiId( p->pGia, Id, i )
    if ( Nf_ObjMapRefNum(p, Id, 1) )
        Vec_IntWriteEntry( vMapping, Abc_Var2Lit(Id, 1), -1 );
    // create internal nodes
    Gia_ManForEachAndId( p->pGia, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj(p->pGia, i);
        if ( Gia_ObjIsBuf(pObj) )
        {
            if ( Nf_ObjMapRefNum(p, i, 1) )
                Vec_IntWriteEntry( vMapping, Abc_Var2Lit(i, 1), -1 );
            Vec_IntWriteEntry( vMapping, Abc_Var2Lit(i, 0), -2 );
            continue;
        }
        for ( c = 0; c < 2; c++ )
        if ( Nf_ObjMapRefNum(p, i, c) )
        {
            pM = Nf_ObjMatchBest( p, i, c );
            // remember inverter
            if ( pM->fCompl )
            {
                Vec_IntWriteEntry( vMapping, Abc_Var2Lit(i, c), -1 );
                continue;
            }
    //        Nf_ManCutMatchPrint( p, i, c, pM );
            pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pM->CutH );
            Vec_IntWriteEntry( vMapping, Abc_Var2Lit(i, c), Vec_IntSize(vMapping) );
            Vec_IntPush( vMapping, Nf_CutSize(pCut) );
            Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
                Vec_IntPush( vMapping, Abc_Var2Lit(iVar, fCompl) );
            Vec_IntPush( vMapping, pM->Gate );
        }
    }
//    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vCellMapping = vMapping;
    return p->pGia;
}